

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsViewPrivate::mapRectFromScene
          (QRectF *__return_storage_ptr__,QGraphicsViewPrivate *this,QRectF *rect)

{
  long lVar1;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x300 & 0x20) != 0) {
    updateScroll(this);
  }
  if ((this->field_0x300 & 0x10) == 0) {
    QTransform::mapRect(&local_48);
  }
  else {
    local_48.xp = rect->xp;
    local_48.yp = rect->yp;
    local_48.w = rect->w;
    local_48.h = rect->h;
  }
  lVar1 = this->scrollY;
  __return_storage_ptr__->xp = (double)-this->scrollX + local_48.xp;
  __return_storage_ptr__->yp = (double)-lVar1 + local_48.yp;
  __return_storage_ptr__->w = local_48.w;
  __return_storage_ptr__->h = local_48.h;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsViewPrivate::mapRectFromScene(const QRectF &rect) const
{
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();
    return (identityMatrix ? rect : matrix.mapRect(rect)).translated(-scrollX, -scrollY);
}